

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequence.hpp
# Opt level: O3

void __thiscall
biosoup::Sequence::Sequence
          (Sequence *this,char *name,uint32_t name_len,char *data,uint32_t data_len,char *quality,
          uint32_t quality_len)

{
  __atomic_base<unsigned_int> _Var1;
  
  LOCK();
  UNLOCK();
  _Var1._M_i = (num_objects.super___atomic_base<unsigned_int>._M_i + 1)._M_i;
  this->id = (uint32_t)num_objects.super___atomic_base<unsigned_int>._M_i;
  num_objects.super___atomic_base<unsigned_int>._M_i =
       (__atomic_base<unsigned_int>)(__atomic_base<unsigned_int>)_Var1._M_i;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->name,name,name + name_len);
  (this->data)._M_dataplus._M_p = (pointer)&(this->data).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->data,data,data + data_len);
  (this->quality)._M_dataplus._M_p = (pointer)&(this->quality).field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->quality,quality,quality + quality_len);
  return;
}

Assistant:

Sequence(
      const char* name, std::uint32_t name_len,
      const char* data, std::uint32_t data_len,
      const char* quality, std::uint32_t quality_len)
      : id(num_objects++),
        name(name, name_len),
        data(data, data_len),
        quality(quality, quality_len) {}